

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11FrameProcessor.cpp
# Opt level: O0

DUPL_RETURN __thiscall
SL::Screen_Capture::X11FrameProcessor::Init
          (X11FrameProcessor *this,shared_ptr<SL::Screen_Capture::Thread_Data> *data,
          Window *selectedwindow)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 uVar4;
  pointer paVar5;
  char *pcVar6;
  undefined8 *in_RDX;
  long in_RDI;
  bool bVar7;
  int scr;
  DUPL_RETURN ret;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff94;
  DUPL_RETURN local_4;
  
  std::shared_ptr<SL::Screen_Capture::Thread_Data>::operator=
            ((shared_ptr<SL::Screen_Capture::Thread_Data> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (shared_ptr<SL::Screen_Capture::Thread_Data> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar4 = XOpenDisplay(0);
  *(undefined8 *)(in_RDI + 0x20) = uVar4;
  *(undefined8 *)(in_RDI + 0x28) = *in_RDX;
  bVar7 = *(long *)(in_RDI + 0x20) != 0;
  if (bVar7) {
    iVar3 = XDefaultScreen(*(undefined8 *)(in_RDI + 0x20));
    std::make_unique<XShmSegmentInfo>();
    std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::operator=
              ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::~unique_ptr
              ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar4 = *(undefined8 *)(in_RDI + 0x20);
    uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x20) + 0xe8) + (long)iVar3 * 0x80 + 0x40);
    uVar1 = *(undefined4 *)(*(long *)(*(long *)(in_RDI + 0x20) + 0xe8) + (long)iVar3 * 0x80 + 0x38);
    paVar5 = std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::get
                       ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar8 = *(undefined4 *)((long)in_RDX + 0x14);
    uVar4 = XShmCreateImage(uVar4,uVar2,uVar1,2,0,paVar5,*(undefined4 *)(in_RDX + 2));
    *(undefined8 *)(in_RDI + 0x30) = uVar4;
    iVar3 = shmget(0,(long)(*(int *)(*(long *)(in_RDI + 0x30) + 0x2c) *
                           *(int *)(*(long *)(in_RDI + 0x30) + 4)),0x3ff);
    paVar5 = std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::operator->
                       ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
                        0x14a8fd);
    paVar5->shmid = iVar3;
    paVar5 = std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::operator->
                       ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
                        0x14a912);
    paVar5->readOnly = 0;
    paVar5 = std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::operator->
                       ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
                        0x14a927);
    pcVar6 = (char *)shmat(paVar5->shmid,(void *)0x0,0);
    *(char **)(*(long *)(in_RDI + 0x30) + 0x10) = pcVar6;
    paVar5 = std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::operator->
                       ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
                        0x14a953);
    paVar5->shmaddr = pcVar6;
    uVar4 = *(undefined8 *)(in_RDI + 0x20);
    paVar5 = std::unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>::get
                       ((unique_ptr<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,uVar8));
    XShmAttach(uVar4,paVar5);
  }
  local_4 = (DUPL_RETURN)!bVar7;
  return local_4;
}

Assistant:

DUPL_RETURN X11FrameProcessor::Init(std::shared_ptr<Thread_Data> data, const Window& selectedwindow){
        
        auto ret = DUPL_RETURN::DUPL_RETURN_SUCCESS;
        Data = data; 
        SelectedDisplay = XOpenDisplay(NULL);
        SelectedWindow = selectedwindow.Handle;
        if(!SelectedDisplay) {
            return DUPL_RETURN::DUPL_RETURN_ERROR_EXPECTED;
        }
        int scr = XDefaultScreen(SelectedDisplay);

        ShmInfo = std::make_unique<XShmSegmentInfo>();

        XImage_ = XShmCreateImage(SelectedDisplay,
                                DefaultVisual(SelectedDisplay, scr),
                                DefaultDepth(SelectedDisplay, scr),
                                ZPixmap,
                                NULL,
                                ShmInfo.get(),
                                selectedwindow.Size.x,
                                selectedwindow.Size.y);
        ShmInfo->shmid = shmget(IPC_PRIVATE, XImage_->bytes_per_line * XImage_->height, IPC_CREAT | 0777);

        ShmInfo->readOnly = False;
        ShmInfo->shmaddr = XImage_->data = (char*)shmat(ShmInfo->shmid, 0, 0);

        XShmAttach(SelectedDisplay, ShmInfo.get());

        return ret;
    }